

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall
mkvparser::AudioTrack::AudioTrack
          (AudioTrack *this,Segment *pSegment,longlong element_start,longlong element_size)

{
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__Track_005c6358;
  (this->super_Track).m_pSegment = pSegment;
  (this->super_Track).m_element_start = element_start;
  (this->super_Track).m_element_size = element_size;
  Track::Info::Info(&(this->super_Track).m_info);
  Track::EOSBlock::EOSBlock(&(this->super_Track).m_eos);
  (this->super_Track).content_encoding_entries_ = (ContentEncoding **)0x0;
  (this->super_Track).content_encoding_entries_end_ = (ContentEncoding **)0x0;
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__Track_005c64f8;
  return;
}

Assistant:

AudioTrack::AudioTrack(Segment* pSegment, long long element_start,
                       long long element_size)
    : Track(pSegment, element_start, element_size) {}